

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O2

JL_STATUS JlSetObjectNumberS64(JlDataObject *NumberObject,int64_t NumberS64)

{
  JL_STATUS JVar1;
  
  if (NumberObject == (JlDataObject *)0x0) {
    JVar1 = JL_STATUS_INVALID_PARAMETER;
  }
  else {
    if (NumberObject->Type == JL_DATA_TYPE_NUMBER) {
      (NumberObject->field_2).Number.Type = JL_NUM_TYPE_SIGNED;
      (NumberObject->field_2).Number.field_1.s64 = NumberS64;
      return JL_STATUS_SUCCESS;
    }
    JVar1 = JL_STATUS_WRONG_TYPE;
  }
  return JVar1;
}

Assistant:

JL_STATUS
    JlSetObjectNumberS64
    (
        JlDataObject*   NumberObject,
        int64_t         NumberS64
    )
{
    JL_STATUS jlStatus;

    if( NULL != NumberObject )
    {
        if( JL_DATA_TYPE_NUMBER == NumberObject->Type )
        {
            NumberObject->Number.Type = JL_NUM_TYPE_SIGNED;
            NumberObject->Number.s64 = NumberS64;
            jlStatus = JL_STATUS_SUCCESS;
        }
        else
        {
            jlStatus = JL_STATUS_WRONG_TYPE;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}